

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O2

bool IsPrehistorikTrack(Track *track)

{
  pointer pSVar1;
  bool bVar2;
  int iVar3;
  vector<Sector,_std::allocator<Sector>_> *pvVar4;
  Data *pDVar5;
  Sector *s;
  pointer this;
  bool bVar6;
  
  pvVar4 = Track::sectors(track);
  pSVar1 = (pvVar4->super__Vector_base<Sector,_std::allocator<Sector>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  bVar6 = false;
  for (this = (pvVar4->super__Vector_base<Sector,_std::allocator<Sector>_>)._M_impl.
              super__Vector_impl_data._M_start; this != pSVar1; this = this + 1) {
    if (this->datarate != _250K) {
      return false;
    }
    if (this->encoding != MFM) {
      return false;
    }
    iVar3 = (this->header).size;
    bVar2 = Sector::has_baddatacrc(this);
    if (iVar3 != (uint)bVar2 + (uint)bVar2 * 2 + 2) goto LAB_00175766;
    if (((this->header).sector == 0xc) && ((this->header).size == 5)) {
      pDVar5 = Sector::data_copy(this,0);
      iVar3 = bcmp((pDVar5->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start + 0x1b,"Titus",5);
      bVar6 = true;
      if (iVar3 != 0) {
        return false;
      }
    }
  }
  if (bVar6) {
    bVar6 = true;
    if (opt.debug != 0) {
      util::operator<<((LogHelper *)&util::cout,(char (*) [28])"detected Prehistorik track\n");
    }
  }
  else {
LAB_00175766:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool IsPrehistorikTrack(const Track& track)
{
    bool found_12{ false };

    for (auto& s : track.sectors())
    {
        if (s.datarate != DataRate::_250K || s.encoding != Encoding::MFM ||
            s.header.size != (s.has_baddatacrc() ? 5 : 2))
            return false;

        // The 4K sector 12 contains the protection signature.
        if (s.header.sector == 12 && s.header.size == 5)
        {
            found_12 = true;

            auto& data12 = s.data_copy();
            if (memcmp(data12.data() + 0x1b, "Titus", 5))
                return false;
        }
    }

    if (!found_12)
        return false;

    if (opt.debug) util::cout << "detected Prehistorik track\n";
    return true;
}